

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gc.cpp
# Opt level: O0

void anon_unknown.dwarf_44f6e::Gc::expect_call
               (test_watch_thread *gc,string *path,process_identifier pid)

{
  MockSpec<int_(std::initializer_list<const_char_*>)> *this;
  TypedExpectation<int_(std::initializer_list<const_char_*>)> *pTVar1;
  MockSpec<void_(const_int_&)> *this_00;
  TypedExpectation<void_(const_int_&)> *pTVar2;
  StringLike<std::__cxx11::basic_string<char>_> *str;
  void **in_R8;
  undefined1 auVar3 [16];
  ExpectationSet local_1d8;
  WithoutMatchers local_1a5;
  ComparisonBase<testing::internal::EqMatcher<int>,_int,_testing::internal::AnyEq> local_1a4;
  Matcher<const_int_&> local_1a0;
  MockSpec<void_(const_int_&)> local_188;
  ReturnAction<int> local_168;
  Action<int_(std::initializer_list<const_char_*>)> local_158;
  WithoutMatchers local_131;
  undefined1 local_130 [64];
  undefined8 local_f0;
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  ElementsAreMatcher<std::tuple<testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::nullptr_t>_>
  local_c0;
  Matcher<std::initializer_list<const_char_*>_> local_68;
  MockSpec<int_(std::initializer_list<const_char_*>)> local_50;
  undefined1 local_30 [8];
  Expectation exp;
  process_identifier pid_local;
  string *path_local;
  test_watch_thread *gc_local;
  
  exp.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = pid;
  auVar3 = std::__cxx11::string::c_str();
  local_f0 = auVar3._0_8_;
  testing::StrEq<char_const*>(&local_e8,(testing *)&local_f0,auVar3._8_8_);
  testing::StrEq<std::__cxx11::string>
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_130 + 0x18),(testing *)path,str);
  local_130._0_8_ = 0;
  testing::
  ElementsAre<testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::string>>,decltype(nullptr)>
            (&local_c0,(testing *)&local_e8,
             (PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_130 + 0x18),
             (PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_130,in_R8);
  testing::internal::ElementsAreMatcher::operator_cast_to_Matcher
            (&local_68,(ElementsAreMatcher *)&local_c0);
  test_watch_thread::gmock_spawn(&local_50,gc,&local_68);
  testing::internal::GetWithoutMatchers();
  this = testing::internal::MockSpec<int_(std::initializer_list<const_char_*>)>::operator()
                   (&local_50,&local_131,(void *)0x0);
  pTVar1 = testing::internal::MockSpec<int_(std::initializer_list<const_char_*>)>::
           InternalExpectedAt(this,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_gc.cpp"
                              ,0x7b,"gc",
                              "spawn (ElementsAre (StrEq (vacuum_exe.c_str ()), StrEq (path), nullptr))"
                             );
  testing::Return<int>
            ((testing *)&local_168,
             exp.expectation_base_.
             super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._4_4_);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_158,(ReturnAction *)&local_168);
  pTVar1 = testing::internal::TypedExpectation<int_(std::initializer_list<const_char_*>)>::WillOnce
                     (pTVar1,&local_158);
  testing::Expectation::Expectation((Expectation *)local_30,&pTVar1->super_ExpectationBase);
  testing::Action<int_(std::initializer_list<const_char_*>)>::~Action(&local_158);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_168);
  testing::internal::MockSpec<int_(std::initializer_list<const_char_*>)>::~MockSpec(&local_50);
  testing::Matcher<std::initializer_list<const_char_*>_>::~Matcher(&local_68);
  testing::internal::
  ElementsAreMatcher<std::tuple<testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::nullptr_t>_>
  ::~ElementsAreMatcher(&local_c0);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_130 + 0x18));
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher(&local_e8);
  local_1a4.rhs_ =
       (int)testing::Eq<int>(exp.expectation_base_.
                             super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi._4_4_);
  testing::Matcher<int_const&>::Matcher<testing::internal::EqMatcher<int>,void>
            ((Matcher<int_const&> *)&local_1a0,(EqMatcher<int> *)&local_1a4);
  test_watch_thread::gmock_kill(&local_188,gc,&local_1a0);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<void_(const_int_&)>::operator()
                      (&local_188,&local_1a5,(void *)0x0);
  pTVar2 = testing::internal::MockSpec<void_(const_int_&)>::InternalExpectedAt
                     (this_00,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_gc.cpp"
                      ,0x7d,"gc","kill (Eq (pid))");
  pTVar2 = testing::internal::TypedExpectation<void_(const_int_&)>::Times(pTVar2,1);
  testing::ExpectationSet::ExpectationSet(&local_1d8,(Expectation *)local_30);
  testing::internal::TypedExpectation<void_(const_int_&)>::After(pTVar2,&local_1d8);
  testing::ExpectationSet::~ExpectationSet(&local_1d8);
  testing::internal::MockSpec<void_(const_int_&)>::~MockSpec(&local_188);
  testing::Matcher<const_int_&>::~Matcher(&local_1a0);
  testing::Expectation::~Expectation((Expectation *)local_30);
  return;
}

Assistant:

void Gc::expect_call (test_watch_thread & gc, std::string const & path,
                          process_identifier pid) {
        Expectation const exp =
            EXPECT_CALL (gc,
                         spawn (ElementsAre (StrEq (vacuum_exe.c_str ()), StrEq (path), nullptr)))
                .WillOnce (Return (pid));
        EXPECT_CALL (gc, kill (Eq (pid))).Times (1).After (exp);
    }